

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O0

int __thiscall
Saturation::ManCSPassiveClauseContainer::remove(ManCSPassiveClauseContainer *this,char *__filename)

{
  int extraout_EAX;
  iterator __first;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  it;
  vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_> *in_stack_ffffffffffffffb8;
  Clause *t;
  Clause **in_stack_ffffffffffffffc8;
  __normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
  in_stack_ffffffffffffffd0;
  
  std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::begin(in_stack_ffffffffffffffb8)
  ;
  __first = std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::end
                      (in_stack_ffffffffffffffb8);
  std::
  find<__gnu_cxx::__normal_iterator<Kernel::Clause**,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>,Kernel::Clause*>
            ((__normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
              )__first._M_current,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  t = (Clause *)&this->clauses;
  __gnu_cxx::
  __normal_iterator<Kernel::Clause*const*,std::vector<Kernel::Clause*,std::allocator<Kernel::Clause*>>>
  ::__normal_iterator<Kernel::Clause**>
            ((__normal_iterator<Kernel::Clause_*const_*,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
              *)this,(__normal_iterator<Kernel::Clause_**,_std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>_>
                      *)t);
  std::vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>::erase
            ((vector<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_> *)
             in_stack_ffffffffffffffd0._M_current,(const_iterator)__first._M_current);
  Lib::SingleParamEvent<Kernel::Clause_*>::fire((SingleParamEvent<Kernel::Clause_*> *)this,t);
  return extraout_EAX;
}

Assistant:

void ManCSPassiveClauseContainer::remove(Clause* cl)
{
  ASS(cl->store()==Clause::PASSIVE);

  auto it = std::find(clauses.begin(),clauses.end(),cl);
  ASS(it != clauses.end());
  clauses.erase(it);

  removedEvent.fire(cl);
  ASS(cl->store()!=Clause::PASSIVE);
}